

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O3

void __thiscall DiStefano::PerformLabeling(DiStefano *this)

{
  long lVar1;
  int *piVar2;
  Mat1b *pMVar3;
  long lVar4;
  Mat1i *pMVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  undefined1 uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int *piVar25;
  ulong uVar26;
  ulong uVar27;
  Mat local_90 [96];
  
  piVar25 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar25,piVar25[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar23 = *(int *)&pMVar3->field_0x8;
  uVar6 = *(uint *)&pMVar3->field_0xc;
  uVar26 = (ulong)uVar6;
  lVar11 = (long)((int)((uVar6 - ((int)(uVar6 + 1) >> 0x1f)) + 1) >> 1) *
           (long)((iVar23 - (iVar23 + 1 >> 0x1f)) + 1 >> 1);
  uVar17 = lVar11 + 1;
  uVar27 = -(ulong)(uVar17 >> 0x3e != 0) | lVar11 * 4 + 4U;
  pvVar7 = operator_new__(uVar27);
  pvVar8 = operator_new__(uVar17);
  pvVar9 = operator_new__(uVar27);
  if (iVar23 < 1) {
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  }
  else {
    lVar11 = *(long *)&pMVar3->field_0x10;
    lVar4 = **(long **)&pMVar3->field_0x48;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar18 = *(long *)&pMVar5->field_0x10;
    lVar21 = **(long **)&pMVar5->field_0x48;
    lVar20 = 0;
    uVar6 = 0;
    do {
      if (0 < (int)uVar26) {
        lVar22 = lVar21 * lVar20 + lVar18;
        lVar1 = lVar22 - lVar21;
        lVar24 = 0;
        do {
          if (*(char *)(lVar4 * lVar20 + lVar11 + lVar24) == '\0') {
            uVar17 = 0;
          }
          else {
            uVar17 = 0;
            uVar15 = 0;
            uVar16 = 0;
            uVar10 = 0;
            if (lVar20 != 0) {
              uVar10 = 0;
              if (lVar24 != 0) {
                uVar15 = *(uint *)(lVar1 + -4 + lVar24 * 4);
              }
              uVar16 = *(uint *)(lVar1 + lVar24 * 4);
              if (lVar24 < (int)uVar26 + -1) {
                uVar10 = *(uint *)(lVar1 + 4 + lVar24 * 4);
              }
            }
            if (lVar24 != 0) {
              uVar17 = (ulong)*(uint *)(lVar22 + -4 + lVar24 * 4);
            }
            if ((((uVar15 == 0) && (uVar16 == 0)) && (uVar10 == 0)) && ((int)uVar17 == 0)) {
              lVar12 = (long)(int)uVar6;
              uVar6 = uVar6 + 1;
              *(uint *)((long)pvVar7 + lVar12 * 4 + 4) = uVar6;
              lVar12 = lVar12 + 1;
              uVar14 = 1;
              uVar16 = uVar6;
LAB_0018cf10:
              *(undefined1 *)((long)pvVar8 + lVar12) = uVar14;
            }
            else {
              if (uVar15 != 0) {
                uVar16 = uVar15;
              }
              if ((int)uVar16 < 1) {
LAB_0018cf5f:
                uVar16 = uVar10;
                if ((int)uVar16 < 1) goto LAB_0018cfa9;
              }
              else if (0 < (int)uVar10) {
                iVar23 = *(int *)((long)pvVar7 + (ulong)uVar16 * 4);
                iVar19 = *(int *)((long)pvVar7 + (ulong)uVar10 * 4);
                if (iVar23 != iVar19) {
                  piVar25 = (int *)((long)pvVar7 + (ulong)uVar16 * 4);
                  piVar2 = (int *)((long)pvVar7 + (ulong)uVar10 * 4);
                  if (*(char *)((long)pvVar8 + (long)iVar23) == '\x01') {
                    *piVar25 = iVar19;
                    piVar25 = piVar2;
                  }
                  else {
                    if (*(char *)((long)pvVar8 + (long)iVar19) == '\0') {
                      if (0 < (int)uVar6) {
                        uVar26 = 1;
                        do {
                          if (*(int *)((long)pvVar7 + uVar26 * 4) == iVar19) {
                            *(int *)((long)pvVar7 + uVar26 * 4) = iVar23;
                          }
                          uVar26 = uVar26 + 1;
                          uVar10 = uVar16;
                        } while (uVar6 + 1 != uVar26);
                        goto LAB_0018cf5f;
                      }
                      goto LAB_0018cf8f;
                    }
                    *piVar2 = iVar23;
                  }
                  *(undefined1 *)((long)pvVar8 + (long)*piVar25) = 0;
                }
              }
LAB_0018cf8f:
              if (0 < (int)uVar17) {
                uVar26 = (ulong)uVar16;
                iVar23 = *(int *)((long)pvVar7 + uVar26 * 4);
                iVar19 = *(int *)((long)pvVar7 + uVar17 * 4);
                if (iVar23 != iVar19) {
                  if (*(char *)((long)pvVar8 + (long)iVar23) == '\x01') {
                    *(int *)((long)pvVar7 + uVar26 * 4) = iVar19;
                    iVar23 = *(int *)((long)pvVar7 + uVar17 * 4);
                  }
                  else {
                    if (*(char *)((long)pvVar8 + (long)iVar19) == '\0') {
                      if (0 < (int)uVar6) {
                        uVar17 = 1;
                        do {
                          if (*(int *)((long)pvVar7 + uVar17 * 4) == iVar19) {
                            *(int *)((long)pvVar7 + uVar17 * 4) = iVar23;
                          }
                          uVar17 = uVar17 + 1;
                        } while (uVar6 + 1 != uVar17);
                      }
                      goto LAB_0018cfa6;
                    }
                    *(int *)((long)pvVar7 + uVar17 * 4) = iVar23;
                    iVar23 = *(int *)((long)pvVar7 + uVar26 * 4);
                  }
                  lVar12 = (long)iVar23;
                  uVar14 = 0;
                  goto LAB_0018cf10;
                }
              }
            }
LAB_0018cfa6:
            uVar17 = (ulong)uVar16;
          }
LAB_0018cfa9:
          *(int *)(lVar22 + lVar24 * 4) = (int)uVar17;
          lVar24 = lVar24 + 1;
          uVar26 = (ulong)*(int *)&pMVar3->field_0xc;
        } while (lVar24 < (long)uVar26);
        iVar23 = *(int *)&pMVar3->field_0x8;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar23);
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
    if (0 < (int)uVar6) {
      uVar15 = 0;
      uVar17 = 1;
      do {
        if (uVar17 == *(uint *)((long)pvVar7 + uVar17 * 4)) {
          uVar15 = uVar15 + 1;
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar15;
          *(uint *)((long)pvVar9 + uVar17 * 4) = uVar15;
        }
        uVar17 = uVar17 + 1;
      } while (uVar6 + 1 != uVar17);
      if (0 < (int)uVar6) {
        uVar17 = 1;
        do {
          *(undefined4 *)((long)pvVar7 + uVar17 * 4) =
               *(undefined4 *)((long)pvVar9 + (long)*(int *)((long)pvVar7 + uVar17 * 4) * 4);
          uVar17 = uVar17 + 1;
        } while (uVar6 + 1 != uVar17);
      }
      goto LAB_0018d0bf;
    }
  }
  uVar15 = 0;
LAB_0018d0bf:
  puVar13 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar23 = *(int *)&pMVar5->field_0x8;
  if (0 < iVar23) {
    lVar11 = *(long *)&pMVar5->field_0x10;
    lVar4 = **(long **)&pMVar5->field_0x48;
    iVar19 = *(int *)&pMVar5->field_0xc;
    lVar18 = 0;
    do {
      if (0 < iVar19) {
        lVar21 = 0;
        do {
          lVar20 = (long)*(int *)(lVar11 + lVar21 * 4);
          if (0 < lVar20) {
            *(undefined4 *)(lVar11 + lVar21 * 4) = *(undefined4 *)((long)pvVar7 + lVar20 * 4);
            iVar19 = *(int *)&pMVar5->field_0xc;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < iVar19);
        iVar23 = *(int *)&pMVar5->field_0x8;
      }
      lVar18 = lVar18 + 1;
      lVar11 = lVar11 + lVar4;
    } while (lVar18 < iVar23);
    uVar15 = *puVar13;
  }
  *puVar13 = uVar15 + 1;
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  operator_delete__(pvVar9);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size());

        int i_new_label(0);

        // p q r		  p
        // s x			q x
        // lp,lq,lx: labels assigned to p,q,x

        // First scan
        int *a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        bool *a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        int *a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }

        // Renumbering of labels
        n_labels_ = 0;
        for (int k = 1; k <= i_new_label; k++) {
            if (a_class[k] == k) {
                n_labels_++;
                a_renum[k] = n_labels_;
            }
        }
        for (int k = 1; k <= i_new_label; k++)
            a_class[k] = a_renum[a_class[k]];

        // Second scan
        for (int y = 0; y < img_labels_.rows; y++) {

            // Get rows pointer
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

            for (int x = 0; x < img_labels_.cols; x++) {
                int iLabel = img_labels_row[x];
                if (iLabel > 0)
                    img_labels_row[x] = a_class[iLabel];
            }
        }

        n_labels_++; // To count also background

        delete[] a_class;
        delete[] a_single;
        delete[] a_renum;
    }